

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O2

void __thiscall rtosc::MidiMappernRT::snoop_bToU(MidiMappernRT *this,char *msg)

{
  int ID;
  int ID_00;
  bool bVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  char *__s;
  int v;
  float fVar4;
  MidiBijection MVar5;
  rtosc_arg_t rVar6;
  string args;
  allocator<char> local_71;
  key_type local_70;
  float local_4c;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,msg,&local_71);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
                  *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->inv_map)._M_t._M_impl.super__Rb_tree_header) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,msg,&local_71);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::tuple<int,_int,_int,_rtosc::MidiBijection>_>_>_>
           ::operator[](&this->inv_map,&local_70);
  ID = (pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
       super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.
       super__Tuple_impl<2UL,_int,_rtosc::MidiBijection>.super__Head_base<2UL,_int,_false>.
       _M_head_impl;
  ID_00 = (pmVar3->super__Tuple_impl<0UL,_int,_int,_int,_rtosc::MidiBijection>).
          super__Tuple_impl<1UL,_int,_int,_rtosc::MidiBijection>.super__Head_base<1UL,_int,_false>.
          _M_head_impl;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,msg,(allocator<char> *)&local_70);
  MVar5 = getBijection(this,&local_48);
  local_4c = MVar5.max;
  std::__cxx11::string::~string((string *)&local_48);
  __s = rtosc_argument_string(msg);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_71);
  bVar1 = std::operator==(&local_70,"f");
  if (bVar1) {
    rVar6 = rtosc_argument(msg,0);
    fVar4 = rVar6.f;
  }
  else {
    bVar1 = std::operator==(&local_70,"i");
    if (bVar1) {
      rVar6 = rtosc_argument(msg,0);
      fVar4 = (float)rVar6.i;
    }
    else {
      bVar1 = std::operator==(&local_70,"T");
      if (bVar1) {
        fVar4 = 1.0;
      }
      else {
        bVar1 = std::operator==(&local_70,"F");
        fVar4 = 0.0;
        if (!bVar1) goto LAB_00111017;
      }
    }
  }
  v = 0;
  if (MVar5.mode == 0) {
    v = (int)(((fVar4 - MVar5.min) / (local_4c - MVar5.min)) * 16384.0);
  }
  if (ID_00 != -1) {
    apply_high(this,v,ID_00);
  }
  if (ID != -1) {
    apply_low(this,v,ID);
  }
LAB_00111017:
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void MidiMappernRT::snoop_bToU(const char *msg)
{

    if(inv_map.find(msg) != inv_map.end())
    {
        auto apple = inv_map[msg];
        MidiBijection bi = getBijection(msg);
        float value = 0;
        std::string args = rtosc_argument_string(msg);
        if(args == "f")
            value = rtosc_argument(msg, 0).f;
        else if(args == "i")
            value = rtosc_argument(msg, 0).i;
        else if(args == "T")
            value = 1.0;
        else if(args == "F")
            value = 0.0;
        else
            return;

        int new_midi = bi(value);
        if(std::get<1>(apple) != -1)
            apply_high(new_midi,std::get<1>(apple));
        if(std::get<2>(apple) != -1)
            apply_low(new_midi,std::get<2>(apple));
    }
}